

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathGetElementsByIds(xmlDocPtr doc,xmlChar *ids)

{
  byte bVar1;
  xmlNodeSetPtr cur;
  xmlChar *ID;
  _xmlNode *val;
  int iVar2;
  byte *pbVar3;
  
  if (ids != (xmlChar *)0x0) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
    }
    pbVar3 = ids;
    if (cur != (xmlNodeSetPtr)0x0) {
      while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
        pbVar3 = pbVar3 + 1;
      }
      bVar1 = *pbVar3;
      while( true ) {
        if (bVar1 == 0) {
          return cur;
        }
        iVar2 = (int)pbVar3 - (int)ids;
        while ((0x20 < (ulong)*pbVar3 || ((0x100002601U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))) {
          pbVar3 = pbVar3 + 1;
          iVar2 = iVar2 + 1;
        }
        ID = xmlStrndup(ids,iVar2);
        if (ID == (xmlChar *)0x0) break;
        val = (_xmlNode *)xmlGetID(doc,ID);
        (*xmlFree)(ID);
        if (val != (xmlNodePtr)0x0) {
          if (val->type != XML_ELEMENT_NODE) {
            if (val->type == XML_ATTRIBUTE_NODE) {
              val = val->parent;
            }
            else {
              val = (xmlNodePtr)0x0;
            }
          }
          if ((val != (xmlNodePtr)0x0) && (iVar2 = xmlXPathNodeSetAdd(cur,val), iVar2 < 0)) break;
        }
        while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
          pbVar3 = pbVar3 + 1;
        }
        bVar1 = *pbVar3;
        ids = pbVar3;
      }
      xmlXPathFreeNodeSet(cur);
    }
  }
  return (xmlNodeSetPtr)0x0;
}

Assistant:

static xmlNodeSetPtr
xmlXPathGetElementsByIds (xmlDocPtr doc, const xmlChar *ids) {
    xmlNodeSetPtr ret;
    const xmlChar *cur = ids;
    xmlChar *ID;
    xmlAttrPtr attr;
    xmlNodePtr elem = NULL;

    if (ids == NULL) return(NULL);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);

    while (IS_BLANK_CH(*cur)) cur++;
    while (*cur != 0) {
	while ((!IS_BLANK_CH(*cur)) && (*cur != 0))
	    cur++;

        ID = xmlStrndup(ids, cur - ids);
	if (ID == NULL) {
            xmlXPathFreeNodeSet(ret);
            return(NULL);
        }
        /*
         * We used to check the fact that the value passed
         * was an NCName, but this generated much troubles for
         * me and Aleksey Sanin, people blatantly violated that
         * constraint, like Visa3D spec.
         * if (xmlValidateNCName(ID, 1) == 0)
         */
        attr = xmlGetID(doc, ID);
        xmlFree(ID);
        if (attr != NULL) {
            if (attr->type == XML_ATTRIBUTE_NODE)
                elem = attr->parent;
            else if (attr->type == XML_ELEMENT_NODE)
                elem = (xmlNodePtr) attr;
            else
                elem = NULL;
            if (elem != NULL) {
                if (xmlXPathNodeSetAdd(ret, elem) < 0) {
                    xmlXPathFreeNodeSet(ret);
                    return(NULL);
                }
            }
        }

	while (IS_BLANK_CH(*cur)) cur++;
	ids = cur;
    }
    return(ret);
}